

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.cc
# Opt level: O0

void ChaCha20_ctr32(uint8_t *out,uint8_t *in,size_t in_len,uint32_t *key,uint32_t *counter)

{
  int iVar1;
  uint32_t *counter_local;
  uint32_t *key_local;
  size_t in_len_local;
  uint8_t *in_local;
  uint8_t *out_local;
  
  iVar1 = ChaCha20_ctr32_avx2_capable(in_len);
  if (iVar1 == 0) {
    iVar1 = ChaCha20_ctr32_ssse3_4x_capable(in_len);
    if (iVar1 == 0) {
      iVar1 = ChaCha20_ctr32_ssse3_capable(in_len);
      if (iVar1 == 0) {
        if (in_len != 0) {
          ChaCha20_ctr32_nohw(out,in,in_len,key,counter);
        }
      }
      else {
        ChaCha20_ctr32_ssse3(out,in,in_len,key,counter);
      }
    }
    else {
      ChaCha20_ctr32_ssse3_4x(out,in,in_len,key,counter);
    }
  }
  else {
    ChaCha20_ctr32_avx2(out,in,in_len,key,counter);
  }
  return;
}

Assistant:

static void ChaCha20_ctr32(uint8_t *out, const uint8_t *in, size_t in_len,
                           const uint32_t key[8], const uint32_t counter[4]) {
#if defined(CHACHA20_ASM_NEON)
  if (ChaCha20_ctr32_neon_capable(in_len)) {
    ChaCha20_ctr32_neon(out, in, in_len, key, counter);
    return;
  }
#endif
#if defined(CHACHA20_ASM_AVX2)
  if (ChaCha20_ctr32_avx2_capable(in_len)) {
    ChaCha20_ctr32_avx2(out, in, in_len, key, counter);
    return;
  }
#endif
#if defined(CHACHA20_ASM_SSSE3_4X)
  if (ChaCha20_ctr32_ssse3_4x_capable(in_len)) {
    ChaCha20_ctr32_ssse3_4x(out, in, in_len, key, counter);
    return;
  }
#endif
#if defined(CHACHA20_ASM_SSSE3)
  if (ChaCha20_ctr32_ssse3_capable(in_len)) {
    ChaCha20_ctr32_ssse3(out, in, in_len, key, counter);
    return;
  }
#endif
  if (in_len > 0) {
    ChaCha20_ctr32_nohw(out, in, in_len, key, counter);
  }
}